

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_buffer_encoder.c
# Opt level: O1

size_t lzma_block_buffer_bound(size_t uncompressed_size)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  
  if (uncompressed_size < 0x7ffffffffffffbbd) {
    uVar2 = uncompressed_size + 0xffff >> 0x10;
    lVar3 = 0;
    if (uncompressed_size <= uVar2 * -3 + 0x7ffffffffffffbbb) {
      lVar3 = uncompressed_size + 1 + uVar2 * 3;
    }
  }
  else {
    lVar3 = 0;
  }
  sVar1 = (lVar3 + 3U & 0xfffffffffffffffc) + 0x5c;
  if (lVar3 == 0) {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

extern LZMA_API(size_t)
lzma_block_buffer_bound(size_t uncompressed_size)
{
	uint64_t ret = lzma_block_buffer_bound64(uncompressed_size);

#if SIZE_MAX < UINT64_MAX
	// Catch the possible integer overflow on 32-bit systems.
	if (ret > SIZE_MAX)
		return 0;
#endif

	return ret;
}